

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlAttrPtr xmlHasProp(xmlNode *node,xmlChar *name)

{
  _xmlDoc *p_Var1;
  int iVar2;
  xmlAttributePtr pxVar3;
  xmlAttrPtr pxVar4;
  
  if (node != (xmlNode *)0x0) {
    if (name == (xmlChar *)0x0) {
      return (xmlAttrPtr)0x0;
    }
    if (node->type != XML_ELEMENT_NODE) {
      return (xmlAttrPtr)0x0;
    }
    for (pxVar4 = node->properties; pxVar4 != (xmlAttrPtr)0x0; pxVar4 = pxVar4->next) {
      iVar2 = xmlStrEqual(pxVar4->name,name);
      if (iVar2 != 0) {
        return pxVar4;
      }
    }
    p_Var1 = node->doc;
    if ((((p_Var1 != (_xmlDoc *)0x0) && (p_Var1->intSubset != (xmlDtdPtr)0x0)) &&
        ((pxVar3 = xmlGetDtdAttrDesc(p_Var1->intSubset,node->name,name),
         pxVar3 != (xmlAttributePtr)0x0 ||
         ((p_Var1->extSubset != (xmlDtdPtr)0x0 &&
          (pxVar3 = xmlGetDtdAttrDesc(p_Var1->extSubset,node->name,name),
          pxVar3 != (xmlAttributePtr)0x0)))))) && (pxVar3->defaultValue != (xmlChar *)0x0)) {
      return (xmlAttrPtr)pxVar3;
    }
  }
  return (xmlAttrPtr)0x0;
}

Assistant:

xmlAttrPtr
xmlHasProp(const xmlNode *node, const xmlChar *name) {
    xmlAttrPtr prop;
    xmlDocPtr doc;

    if ((node == NULL) || (node->type != XML_ELEMENT_NODE) || (name == NULL))
        return(NULL);
    /*
     * Check on the properties attached to the node
     */
    prop = node->properties;
    while (prop != NULL) {
        if (xmlStrEqual(prop->name, name))  {
	    return(prop);
        }
	prop = prop->next;
    }

    /*
     * Check if there is a default declaration in the internal
     * or external subsets
     */
    doc =  node->doc;
    if (doc != NULL) {
        xmlAttributePtr attrDecl;
        if (doc->intSubset != NULL) {
	    attrDecl = xmlGetDtdAttrDesc(doc->intSubset, node->name, name);
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdAttrDesc(doc->extSubset, node->name, name);
            if ((attrDecl != NULL) && (attrDecl->defaultValue != NULL))
              /* return attribute declaration only if a default value is given
                 (that includes #FIXED declarations) */
		return((xmlAttrPtr) attrDecl);
	}
    }
    return(NULL);
}